

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

void nop_random_cb(uv_random_t *req,int status,void *buf,size_t len)

{
  random_info *ri;
  size_t len_local;
  void *buf_local;
  int status_local;
  uv_random_t *req_local;
  
  if (status != -0x7d) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x9c,"status == UV_ECANCELED");
    abort();
  }
  if ((uv_random_t *)buf != req + 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x9d,"buf == (void*) ri->buf");
    abort();
  }
  if (len != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x9e,"len == sizeof(ri->buf)");
    abort();
  }
  done_cb_called = done_cb_called + 1;
  return;
}

Assistant:

static void nop_random_cb(uv_random_t* req, int status, void* buf, size_t len) {
  struct random_info* ri;

  ri = container_of(req, struct random_info, random_req);

  ASSERT(status == UV_ECANCELED);
  ASSERT(buf == (void*) ri->buf);
  ASSERT(len == sizeof(ri->buf));

  done_cb_called++;
}